

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

int rtosc_subpath_pat_type(char *pattern)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  byte *pbVar7;
  
  pcVar4 = strrchr(pattern,0x2a);
  pcVar5 = strchr(pattern,0x23);
  iVar3 = strcmp("*",pattern);
  if (iVar3 == 0) {
    iVar3 = 1;
  }
  else {
    bVar6 = *pattern;
    if (bVar6 == 0) {
      bVar1 = false;
    }
    else {
      pbVar7 = (byte *)(pattern + 1);
      bVar2 = true;
      do {
        bVar1 = false;
        if (((-1 < (char)bVar6) &&
            (((0x2f < bVar6 || ((0x800900000000U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) &&
             (bVar1 = false, bVar6 != 0x7b)))) && (bVar6 != 0x7d)) {
          bVar1 = bVar2;
        }
        bVar6 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        bVar2 = bVar1;
      } while (bVar6 != 0);
      bVar1 = !bVar1;
    }
    if ((bVar1) || (iVar3 = 2, pcVar4 != (char *)0x0)) {
      iVar3 = (uint)(pcVar5 != (char *)0x0) * 5 + 2;
    }
  }
  return iVar3;
}

Assistant:

int rtosc_subpath_pat_type(const char *pattern)
{
    int charwise_only = 1;
    const char *last_star = strrchr(pattern, '*');
    const char *pound = strchr(pattern, '#');
    if(!strcmp("*", pattern))
        return RTOSC_MATCH_ALL;

    for(const char *p = pattern;*p;++p)
        charwise_only &= is_charwise(*p);
    if(charwise_only && !last_star)
        return RTOSC_MATCH_CHAR;
    if(pound)
        return RTOSC_MATCH_ENUMERATED;


    return 2;
}